

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,char *filename)

{
  double dVar1;
  int iVar2;
  REF_INT node0;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  double dVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_DBL *scalar;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  REF_DBL normdev;
  char *local_e8;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  REF_DBL quality;
  char *vars [4];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  vars[0] = "q";
  vars[1] = "s";
  vars[2] = "l";
  vars[3] = "n";
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x1170
           ,"ref_gather_surf_status_tec","malloc scalar of REF_DBL negative");
    RVar4 = 1;
  }
  else {
    uVar6 = (ulong)(uint)(ref_node->max << 2);
    scalar = (REF_DBL *)malloc(uVar6 * 8);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1170,"ref_gather_surf_status_tec","malloc scalar of REF_DBL NULL");
      RVar4 = 2;
    }
    else {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        scalar[uVar7] = 1.0;
      }
      ref_cell = ref_grid->cell[3];
      local_e8 = filename;
      for (iVar11 = 0; iVar11 < ref_cell->max; iVar11 = iVar11 + 1) {
        RVar4 = ref_cell_nodes(ref_cell,iVar11,nodes);
        if (RVar4 == 0) {
          uVar5 = ref_node_tri_quality(ref_node,nodes,&quality);
          if (uVar5 != 0) {
            uVar6 = (ulong)uVar5;
            pcVar10 = "tri qual";
            uVar8 = 0x1173;
            goto LAB_0013d2b0;
          }
          normdev = 2.0;
          if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0))
             && (uVar5 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev), uVar5 != 0)) {
            uVar6 = (ulong)uVar5;
            pcVar10 = "norm dev";
            uVar8 = 0x1177;
            goto LAB_0013d2b0;
          }
          uVar6 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar6 = 0;
          }
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            iVar2 = nodes[uVar7];
            dVar1 = scalar[(long)iVar2 * 4];
            if (quality <= scalar[(long)iVar2 * 4]) {
              dVar1 = quality;
            }
            scalar[(long)iVar2 * 4] = dVar1;
            uVar5 = iVar2 * 4 | 3;
            dVar1 = scalar[(int)uVar5];
            if (normdev <= scalar[(int)uVar5]) {
              dVar1 = normdev;
            }
            scalar[(int)uVar5] = dVar1;
          }
        }
      }
      uVar5 = ref_edge_create(&ref_edge,ref_grid);
      if (uVar5 == 0) {
        for (lVar9 = 0; lVar9 < ref_edge->n; lVar9 = lVar9 + 1) {
          node0 = ref_edge->e2n[lVar9 * 2];
          iVar11 = ref_edge->e2n[lVar9 * 2 + 1];
          uVar5 = ref_node_ratio(ref_node,node0,iVar11,&edge_ratio);
          if (uVar5 != 0) {
            uVar6 = (ulong)uVar5;
            pcVar10 = "ratio";
            uVar8 = 0x1184;
            goto LAB_0013d2b0;
          }
          dVar1 = scalar[(long)node0 * 4 + 1];
          dVar3 = (scalar + (long)node0 * 4 + 1)[1];
          uVar6 = -(ulong)(dVar1 < edge_ratio);
          uVar7 = -(ulong)(edge_ratio < dVar3);
          scalar[(long)node0 * 4 + 1] = (REF_DBL)(~uVar6 & (ulong)edge_ratio | (ulong)dVar1 & uVar6)
          ;
          (scalar + (long)node0 * 4 + 1)[1] =
               (REF_DBL)(~uVar7 & (ulong)edge_ratio | (ulong)dVar3 & uVar7);
          dVar1 = scalar[(long)iVar11 * 4 + 1];
          dVar3 = (scalar + (long)iVar11 * 4 + 1)[1];
          uVar6 = -(ulong)(dVar1 < edge_ratio);
          uVar7 = -(ulong)(edge_ratio < dVar3);
          scalar[(long)iVar11 * 4 + 1] =
               (REF_DBL)(~uVar6 & (ulong)edge_ratio | (ulong)dVar1 & uVar6);
          (scalar + (long)iVar11 * 4 + 1)[1] =
               (REF_DBL)(~uVar7 & (ulong)edge_ratio | (ulong)dVar3 & uVar7);
        }
        uVar5 = ref_edge_free(ref_edge);
        if (uVar5 == 0) {
          uVar5 = ref_gather_scalar_surf_tec(ref_grid,4,scalar,vars,local_e8);
          if (uVar5 == 0) {
            free(scalar);
            return 0;
          }
          uVar6 = (ulong)uVar5;
          pcVar10 = "dump";
          uVar8 = 0x118d;
        }
        else {
          uVar6 = (ulong)uVar5;
          pcVar10 = "free edges";
          uVar8 = 0x118a;
        }
      }
      else {
        uVar6 = (ulong)uVar5;
        pcVar10 = "create edges";
        uVar8 = 0x1180;
      }
LAB_0013d2b0:
      RVar4 = (REF_STATUS)uVar6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar8,"ref_gather_surf_status_tec",uVar6,pcVar10);
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_gather_surf_status_tec(REF_GRID ref_grid,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *scalar, quality, normdev;
  REF_INT cell, edge, node0, node1, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  const char *vars[4];
  REF_INT ldim = 4;

  vars[0] = "q";
  vars[1] = "s";
  vars[2] = "l";
  vars[3] = "n";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
    normdev = 2.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      scalar[0 + ldim * nodes[cell_node]] =
          MIN(scalar[0 + ldim * nodes[cell_node]], quality);
      scalar[3 + ldim * nodes[cell_node]] =
          MIN(scalar[3 + ldim * nodes[cell_node]], normdev);
    }
  }
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
    scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
    scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_surf_tec(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}